

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O3

void run_init_quads_task(parallel_task_1d *task,size_t thread_id)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  work_item *pwVar9;
  long lVar10;
  work_item *pwVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  init_primitives_task *init_primitives_task;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  
  uVar16 = (task->range).begin;
  uVar8 = (task->range).end;
  lVar17 = uVar8 - uVar16;
  if (uVar16 <= uVar8 && lVar17 != 0) {
    pwVar9 = task[1].work_item.next;
    lVar10 = *(long *)(pwVar9[1].work_fn + 8);
    pfVar18 = (float *)(task[1].work_item.work_fn + uVar16 * 0x48 + 0x44);
    uVar16 = uVar16 << 5 | 0x18;
    do {
      pwVar11 = pwVar9->next;
      lVar12 = *(long *)((long)pwVar11 + (uVar16 - 0x18));
      lVar13 = *(long *)((long)&pwVar11[-1].work_fn + uVar16);
      lVar14 = *(long *)((long)pwVar11 + (uVar16 - 8));
      lVar15 = *(long *)((long)&pwVar11->work_fn + uVar16);
      uVar4 = *(undefined8 *)(lVar10 + lVar13 * 0xc);
      fVar1 = *(float *)(lVar10 + 8 + lVar13 * 0xc);
      uVar5 = *(undefined8 *)(lVar10 + lVar14 * 0xc);
      fVar2 = *(float *)(lVar10 + 8 + lVar14 * 0xc);
      uVar6 = *(undefined8 *)(lVar10 + lVar15 * 0xc);
      uVar7 = *(undefined8 *)(lVar10 + lVar12 * 0xc);
      fVar26 = *(float *)(lVar10 + 8 + lVar12 * 0xc);
      fVar21 = (float)uVar5;
      fVar22 = (float)((ulong)uVar5 >> 0x20);
      fVar24 = (float)uVar7;
      fVar27 = fVar21 - fVar24;
      fVar25 = (float)((ulong)uVar7 >> 0x20);
      fVar28 = fVar22 - fVar25;
      fVar19 = (float)uVar4;
      fVar24 = fVar24 - fVar19;
      fVar20 = (float)((ulong)uVar4 >> 0x20);
      fVar25 = fVar25 - fVar20;
      fVar23 = fVar2 - fVar26;
      fVar26 = fVar26 - fVar1;
      fVar3 = *(float *)(lVar10 + 8 + lVar15 * 0xc);
      uVar4 = *(undefined8 *)(lVar10 + lVar12 * 0xc);
      pfVar18[-0xf] = *(float *)(lVar10 + 8 + lVar12 * 0xc);
      *(undefined8 *)(pfVar18 + -0x11) = uVar4;
      *(ulong *)(pfVar18 + -0xe) = CONCAT44(fVar25,fVar24);
      pfVar18[-0xc] = fVar26;
      *(ulong *)(pfVar18 + -0xb) = CONCAT44(fVar28,fVar27);
      pfVar18[-9] = fVar23;
      *(ulong *)(pfVar18 + -8) =
           CONCAT44(fVar22 - (float)((ulong)uVar6 >> 0x20),fVar21 - (float)uVar6);
      pfVar18[-6] = fVar2 - fVar3;
      *(ulong *)(pfVar18 + -5) = CONCAT44(fVar20 - fVar22,fVar19 - fVar21);
      pfVar18[-3] = fVar1 - fVar2;
      *(ulong *)(pfVar18 + -2) =
           CONCAT44(fVar26 * fVar27 - fVar23 * fVar24,fVar25 * fVar23 - fVar26 * fVar28);
      *pfVar18 = fVar28 * fVar24 - fVar27 * fVar25;
      pfVar18 = pfVar18 + 0x12;
      uVar16 = uVar16 + 0x20;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  return;
}

Assistant:

static void run_init_quads_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct init_primitives_task* init_primitives_task = (void*)task;
    struct quad* quads = init_primitives_task->primitives;
    const struct mesh* mesh = init_primitives_task->mesh;
    const struct vec3* vertices = mesh->attrs[ATTR_POSITION].data;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct vec3* v0 = &vertices[mesh->indices[i * 4 + 0]];
        const struct vec3* v1 = &vertices[mesh->indices[i * 4 + 1]];
        const struct vec3* v2 = &vertices[mesh->indices[i * 4 + 2]];
        const struct vec3* v3 = &vertices[mesh->indices[i * 4 + 3]];
        quads[i] = make_quad(v0, v1, v2, v3);
    }
}